

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

PortHeaderSyntax * __thiscall
slang::parsing::Parser::parsePortHeader(Parser *this,Token constKeyword,Token direction)

{
  Token varKeyword;
  bool bVar1;
  ImplicitTypeSyntax *dataType;
  SyntaxNode *this_00;
  NetPortHeaderSyntax *pNVar2;
  SourceLocation location;
  DotMemberClauseSyntax *pDVar3;
  InterfacePortHeaderSyntax *pIVar4;
  VariablePortHeaderSyntax *pVVar5;
  undefined8 uVar6;
  TokenKind kind;
  Info *pIVar7;
  uint uVar8;
  Token TVar9;
  SourceRange range;
  Token direction_00;
  Token direction_local;
  Token local_a8;
  Token local_98;
  Token local_88;
  Token local_78;
  InterfacePortHeaderSyntax *header;
  SyntaxKind local_60;
  SyntaxNode *local_58;
  SyntaxNode *pSStack_50;
  size_t local_48;
  pointer ppVStack_40;
  __extent_storage<18446744073709551615UL> local_38;
  
  pIVar7 = direction.info;
  uVar6 = direction._0_8_;
  direction_local._0_8_ = uVar6;
  direction_local.info = pIVar7;
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  kind = TVar9.kind;
  if (constKeyword.info == (Info *)0x0) {
    uVar8 = TVar9._0_4_ & 0xffff;
    bVar1 = slang::syntax::SyntaxFacts::isNetType(kind);
    if (bVar1) {
      TVar9 = ParserBase::consume(&this->super_ParserBase);
      this_00 = (SyntaxNode *)parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x1);
      if ((TVar9.kind == InterconnectKeyword) &&
         ((this_00->kind != ImplicitType || (this_00[1].parent != (SyntaxNode *)0x0)))) {
        range = slang::syntax::SyntaxNode::sourceRange(this_00);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x660005,range);
      }
      pNVar2 = slang::syntax::SyntaxFactory::netPortHeader
                         (&this->factory,direction,TVar9,(DataTypeSyntax *)this_00);
      return &pNVar2->super_PortHeaderSyntax;
    }
    if (kind != Identifier) {
      if (uVar8 != 0x143) {
        if (uVar8 == 200) {
          if (pIVar7 != (Info *)0x0) {
            location = Token::location(&direction_local);
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x210005,location);
          }
          TVar9 = ParserBase::consume(&this->super_ParserBase);
          pDVar3 = parseDotMemberClause(this);
          pIVar4 = slang::syntax::SyntaxFactory::interfacePortHeader(&this->factory,TVar9,pDVar3);
          return &pIVar4->super_PortHeaderSyntax;
        }
        goto LAB_00354297;
      }
      goto LAB_00354169;
    }
    TVar9 = ParserBase::peek(&this->super_ParserBase,1);
    if (((TVar9.kind == Dot) &&
        (TVar9 = ParserBase::peek(&this->super_ParserBase,2), TVar9.kind == Identifier)) &&
       (TVar9 = ParserBase::peek(&this->super_ParserBase,3), TVar9.kind == Identifier)) {
      TVar9 = ParserBase::consume(&this->super_ParserBase);
      pDVar3 = parseDotMemberClause(this);
      header = slang::syntax::SyntaxFactory::interfacePortHeader(&this->factory,TVar9,pDVar3);
      std::
      vector<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
      ::push_back(&(this->meta).interfacePorts,&header);
      return &header->super_PortHeaderSyntax;
    }
  }
  else if (kind != Identifier) {
    if ((TVar9._0_4_ & 0xffff) != 0x143) {
LAB_00354297:
      Token::Token(&local_98);
      dataType = (ImplicitTypeSyntax *)
                 parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x1);
      local_a8._0_4_ = local_98._0_4_;
      local_a8.rawLen = local_98.rawLen;
      local_a8.info._0_4_ = local_98.info._0_4_;
      local_a8.info._4_4_ = local_98.info._4_4_;
      goto LAB_00354411;
    }
LAB_00354169:
    TVar9 = ParserBase::consume(&this->super_ParserBase);
    dataType = (ImplicitTypeSyntax *)
               parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x1);
    local_a8._0_4_ = TVar9._0_4_;
    local_a8.rawLen = TVar9.rawLen;
    local_a8.info._0_4_ = TVar9.info._0_4_;
    local_a8.info._4_4_ = TVar9.info._4_4_;
    goto LAB_00354411;
  }
  bVar1 = isPlainPortName(this);
  if (bVar1) {
    Token::Token(&local_78);
    local_60 = SyntaxList;
    local_38._M_extent_value = 0;
    local_58 = (SyntaxNode *)0x0;
    pSStack_50 = (SyntaxNode *)0x0;
    local_48 = 0;
    ppVStack_40 = (pointer)0x0;
    header = (InterfacePortHeaderSyntax *)&PTR_getChild_005a2e38;
    TVar9 = ParserBase::placeholderToken(&this->super_ParserBase);
    dataType = slang::syntax::SyntaxFactory::implicitType
                         (&this->factory,local_78,
                          (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&header,TVar9);
    pIVar7 = direction_local.info;
    uVar6 = direction_local._0_8_;
  }
  else {
    dataType = (ImplicitTypeSyntax *)
               parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x0);
  }
  Token::Token(&local_88);
  local_a8._0_4_ = local_88._0_4_;
  local_a8.rawLen = local_88.rawLen;
  local_a8.info._0_4_ = SUB84(local_88.info,0);
  local_a8.info._4_4_ = (undefined4)((ulong)local_88.info >> 0x20);
LAB_00354411:
  varKeyword.rawLen = local_a8.rawLen;
  varKeyword.kind = local_a8.kind;
  varKeyword._2_1_ = local_a8._2_1_;
  varKeyword.numFlags.raw = local_a8.numFlags.raw;
  varKeyword.info._0_4_ = local_a8.info._0_4_;
  varKeyword.info._4_4_ = local_a8.info._4_4_;
  direction_00.info = pIVar7;
  direction_00.kind = (TokenKind)uVar6;
  direction_00._2_1_ = SUB81(uVar6,2);
  direction_00.numFlags.raw = SUB81(uVar6,3);
  direction_00.rawLen = SUB84(uVar6,4);
  pVVar5 = slang::syntax::SyntaxFactory::variablePortHeader
                     (&this->factory,constKeyword,direction_00,varKeyword,
                      &dataType->super_DataTypeSyntax);
  return &pVVar5->super_PortHeaderSyntax;
}

Assistant:

PortHeaderSyntax& Parser::parsePortHeader(Token constKeyword, Token direction) {
    auto kind = peek().kind;

    if (!constKeyword) {
        if (isNetType(kind)) {
            auto netType = consume();
            auto& dataType = parseDataType(TypeOptions::AllowImplicit);

            if (netType.kind == TokenKind::InterconnectKeyword &&
                (dataType.kind != SyntaxKind::ImplicitType ||
                 dataType.as<ImplicitTypeSyntax>().signing)) {
                addDiag(diag::InterconnectTypeSyntax, dataType.sourceRange());
            }

            return factory.netPortHeader(direction, netType, dataType);
        }

        if (kind == TokenKind::InterfaceKeyword) {
            if (direction)
                addDiag(diag::DirectionOnInterfacePort, direction.location());

            auto keyword = consume();
            return factory.interfacePortHeader(keyword, parseDotMemberClause());
        }
    }

    if (kind == TokenKind::VarKeyword) {
        auto varKeyword = consume();
        return factory.variablePortHeader(constKeyword, direction, varKeyword,
                                          parseDataType(TypeOptions::AllowImplicit));
    }

    if (kind == TokenKind::Identifier) {
        // could be a bunch of different things here; scan ahead to see
        if (!constKeyword && peek(1).kind == TokenKind::Dot &&
            peek(2).kind == TokenKind::Identifier && peek(3).kind == TokenKind::Identifier) {
            auto name = consume();
            InterfacePortHeaderSyntax* header =
                &factory.interfacePortHeader(name, parseDotMemberClause());
            meta.interfacePorts.push_back(header);
            return *header;
        }

        DataTypeSyntax* type;
        if (!isPlainPortName())
            type = &parseDataType();
        else
            type = &factory.implicitType(Token(), nullptr, placeholderToken());

        return factory.variablePortHeader(constKeyword, direction, Token(), *type);
    }

    // assume we have some kind of data type here
    return factory.variablePortHeader(constKeyword, direction, Token(),
                                      parseDataType(TypeOptions::AllowImplicit));
}